

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

char * duckdb::NumericHelper::FormatUnsigned<unsigned_short>(unsigned_short value,char *ptr)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  ulong uVar6;
  
  uVar6 = CONCAT62(in_register_0000003a,value);
  uVar5 = (uint)uVar6;
  if (value < 100) {
    uVar6 = uVar6 & 0xffffffff;
  }
  else {
    uVar6 = uVar6 & 0xffffffff;
    do {
      uVar2 = NumericCastImpl<unsigned_int,_int,_false>::Convert
                        (((int)uVar6 + (int)(uVar6 / 100) * -100) * 2);
      uVar3 = uVar6 & 0xffff;
      uVar5 = (uint)(uVar3 >> 2) / 0x19;
      uVar6 = (ulong)uVar5;
      ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2 + 1];
      ptr[-2] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
      ptr = ptr + -2;
    } while (9999 < (uint)uVar3);
  }
  if ((ushort)uVar6 < 10) {
    cVar1 = NumericCastImpl<char,_int,_false>::Convert(uVar5 | 0x30);
    lVar4 = -1;
  }
  else {
    uVar5 = NumericCastImpl<unsigned_int,_int,_false>::Convert(uVar5 * 2);
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar5 + 1];
    cVar1 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar5];
    lVar4 = -2;
  }
  ptr[lVar4] = cVar1;
  return ptr + lVar4;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}